

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spoa_test.cpp
# Opt level: O2

void __thiscall
spoa::test::SpoaAlignmentTest_LargeInput_Test::TestBody(SpoaAlignmentTest_LargeInput_Test *this)

{
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  
  AlignmentEngine::Create((AlignmentEngine *)local_70,kSW,'\x01',-1,-1);
  (**(code **)(*(_func_int **)local_70 + 0x10))(local_70,0xffffffff,1);
  if (local_70 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_70 + 8))();
  }
  return;
}

Assistant:

TEST(SpoaAlignmentTest, LargeInput) {
  auto ae = AlignmentEngine::Create(AlignmentType::kSW, 1, -1, -1);
  try {
    ae->Prealloc(-1, 1);
  } catch (std::invalid_argument& exception) {
    EXPECT_EQ(
        std::string(exception.what()).substr(11),
        "AlignmentEngine::Prealloc] error: too large sequence!");
  }
}